

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

void test_read_at_least_then_until(void)

{
  int iVar1;
  cio_error cVar2;
  memory_stream *ms;
  undefined1 local_40 [4];
  cio_error err;
  cio_read_buffer rb;
  void *buffer;
  size_t buffer_length;
  client *client;
  
  ms = (memory_stream *)malloc(0x100);
  iVar1 = memory_stream_init(ms,test_read_at_least_then_until::test_data);
  UnityAssertEqualNumber
            (0,(long)iVar1,"Could not allocate memory for test!",0x4d3,UNITY_DISPLAY_STYLE_INT);
  read_some_fake.custom_fake = read_some_chunks;
  dummy_read_handler_fake.custom_fake = save_to_check_buffer;
  rb.fetch_ptr = (uint8_t *)malloc(0x17);
  cVar2 = cio_read_buffer_init((cio_read_buffer *)local_40,rb.fetch_ptr,0x17);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Read buffer was not initialized correctly!",0x4db,
             UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_init((cio_buffered_stream *)(ms + 1),(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Buffer was not initialized correctly!",0x4de,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_read_at_least
                    ((cio_buffered_stream *)(ms + 1),(cio_read_buffer *)local_40,0xd,
                     dummy_read_handler,first_check_buffer);
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x4e1,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_read_until
                    ((cio_buffered_stream *)(ms + 1),(cio_read_buffer *)local_40,"HelloWorld",
                     dummy_read_handler,first_check_buffer);
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x4e3,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_close((cio_buffered_stream *)(ms + 1));
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x4e6,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x4e7,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (2,(ulong)dummy_read_handler_fake.call_count,"Handler was not called!",0x4e8,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)dummy_read_handler_fake.arg2_history[0],
             "Handler was not called with CIO_SUCCESS!",0x4e9,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)local_40,(UNITY_INT)dummy_read_handler_fake.arg3_history[0],
             "Handler was not called with original read buffer!",0x4ea,UNITY_DISPLAY_STYLE_INT);
  iVar1 = memcmp(first_check_buffer,"hhhhhhhhhhhhh",0xd);
  if (iVar1 != 0) {
    UnityFail("Handler was not called with correct data!",0x4eb);
  }
  UnityAssertEqualNumber
            (0,(long)dummy_read_handler_fake.arg2_history[1],
             "Handler was not called with CIO_SUCCESS!",0x4ed,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)local_40,(UNITY_INT)dummy_read_handler_fake.arg3_history[1],
             "Handler was not called with original read buffer!",0x4ee,UNITY_DISPLAY_STYLE_INT);
  iVar1 = memcmp(first_check_buffer + 0xd,"MYHelloWorld",0xc);
  if (iVar1 == 0) {
    free(rb.fetch_ptr);
    return;
  }
  UnityFail("Handler was not called with correct data!",0x4ef);
}

Assistant:

static void test_read_at_least_then_until(void)
{
#define BUFFER_FOR_EXACTLY "hhhhhhhhhhhhh"
#define PRE_DELIM "MY"
#define DELIM "HelloWorld"
#define REST "Example"
	struct client *client = malloc(sizeof(*client));

	static const char *test_data = BUFFER_FOR_EXACTLY PRE_DELIM DELIM REST;
	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, test_data), "Could not allocate memory for test!");
	read_some_fake.custom_fake = read_some_chunks;
	dummy_read_handler_fake.custom_fake = save_to_check_buffer;

	size_t buffer_length = strlen(BUFFER_FOR_EXACTLY PRE_DELIM DELIM) - 2;
	void *buffer = malloc(buffer_length);
	struct cio_read_buffer rb;
	enum cio_error err = cio_read_buffer_init(&rb, buffer, buffer_length);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Read buffer was not initialized correctly!");

	err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");

	err = cio_buffered_stream_read_at_least(&client->bs, &rb, strlen(BUFFER_FOR_EXACTLY), dummy_read_handler, first_check_buffer);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	err = cio_buffered_stream_read_until(&client->bs, &rb, DELIM, dummy_read_handler, first_check_buffer);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
	TEST_ASSERT_EQUAL_MESSAGE(2, dummy_read_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, dummy_read_handler_fake.arg2_history[0], "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_EQUAL_MESSAGE(&rb, dummy_read_handler_fake.arg3_history[0], "Handler was not called with original read buffer!");
	TEST_ASSERT_MESSAGE(memcmp((const char *)first_check_buffer, BUFFER_FOR_EXACTLY, strlen(BUFFER_FOR_EXACTLY)) == 0, "Handler was not called with correct data!");

	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, dummy_read_handler_fake.arg2_history[1], "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_EQUAL_MESSAGE(&rb, dummy_read_handler_fake.arg3_history[1], "Handler was not called with original read buffer!");
	TEST_ASSERT_MESSAGE(memcmp((const char *)&first_check_buffer[strlen(BUFFER_FOR_EXACTLY)], PRE_DELIM DELIM, strlen(PRE_DELIM) + strlen(DELIM)) == 0, "Handler was not called with correct data!");

	free(buffer);
}